

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vttreader.cc
# Opt level: O0

int __thiscall libwebvtt::VttReader::GetChar(VttReader *this,char *c)

{
  int iVar1;
  int result;
  char *c_local;
  VttReader *this_local;
  
  if ((c == (char *)0x0) || (this->file_ == (FILE *)0x0)) {
    this_local._4_4_ = -1;
  }
  else {
    iVar1 = fgetc((FILE *)this->file_);
    if (iVar1 == -1) {
      iVar1 = ferror((FILE *)this->file_);
      if (iVar1 == 0) {
        iVar1 = feof((FILE *)this->file_);
        if (iVar1 == 0) {
          this_local._4_4_ = -1;
        }
        else {
          this_local._4_4_ = 1;
        }
      }
      else {
        this_local._4_4_ = -1;
      }
    }
    else {
      *c = (char)iVar1;
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

int VttReader::GetChar(char* c) {
  if (c == NULL || file_ == NULL)
    return -1;

  const int result = fgetc(file_);
  if (result != EOF) {
    *c = static_cast<char>(result);
    return 0;  // success
  }

  if (ferror(file_))
    return -1;  // error

  if (feof(file_))
    return 1;  // EOF

  return -1;  // weird
}